

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_reflect_deleteProperty(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int64_t iVar1;
  JSValueUnion JVar2;
  JSAtom prop;
  int iVar3;
  int64_t iVar4;
  JSValueUnion JVar5;
  JSValue obj;
  JSValue JVar6;
  
  iVar1 = argv->tag;
  if ((int)iVar1 == -1) {
    JVar2 = (JSValueUnion)(argv->u).ptr;
    prop = JS_ValueToAtom(ctx,argv[1]);
    iVar4 = 6;
    if (prop != 0) {
      JVar5.float64 = 0.0;
      obj.tag = iVar1;
      obj.u = (JSValueUnion)(JSValueUnion)JVar2.ptr;
      iVar3 = JS_DeleteProperty(ctx,obj,prop,0);
      JS_FreeAtom(ctx,prop);
      if (-1 < iVar3) {
        JVar5._1_7_ = 0;
        JVar5.int32._0_1_ = iVar3 != 0;
        iVar4 = 1;
      }
      goto LAB_00159b30;
    }
  }
  else {
    JS_ThrowTypeErrorNotAnObject(ctx);
  }
  iVar4 = 6;
  JVar5.float64 = 0.0;
LAB_00159b30:
  JVar6.tag = iVar4;
  JVar6.u.float64 = JVar5.float64;
  return JVar6;
}

Assistant:

static JSValue js_reflect_deleteProperty(JSContext *ctx, JSValueConst this_val,
                                         int argc, JSValueConst *argv)
{
    JSValueConst obj;
    JSAtom atom;
    int ret;

    obj = argv[0];
    if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);
    atom = JS_ValueToAtom(ctx, argv[1]);
    if (unlikely(atom == JS_ATOM_NULL))
        return JS_EXCEPTION;
    ret = JS_DeleteProperty(ctx, obj, atom, 0);
    JS_FreeAtom(ctx, atom);
    if (ret < 0)
        return JS_EXCEPTION;
    else
        return JS_NewBool(ctx, ret);
}